

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

bool __thiscall
OpenMD::SelectionEvaluator::loadScript(SelectionEvaluator *this,string *filename,string *script)

{
  byte bVar1;
  pointer pTVar2;
  pointer pTVar3;
  bool bVar4;
  pointer pvVar5;
  pointer pTVar6;
  bool bVar7;
  undefined1 local_58 [32];
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  local_38;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::clear(&(this->variables)._M_t);
  std::__cxx11::string::_M_assign((string *)&this->filename);
  std::__cxx11::string::_M_assign((string *)&this->script);
  bVar4 = SelectionCompiler::compile(&this->compiler,filename,script);
  if (bVar4) {
    this->pc = 0;
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::vector(&local_38,&(this->compiler).aatokenCompiled);
    local_58._0_8_ =
         (this->aatoken).
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58._8_8_ =
         (this->aatoken).
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_58._16_8_ =
         (this->aatoken).
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->aatoken).
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_38.
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->aatoken).
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_38.
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->aatoken).
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_38.
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_38.
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::~vector((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
               *)local_58);
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::~vector(&local_38);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_58,&(this->compiler).lineNumbers);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->linenumbers,local_58);
    if ((pointer)local_58._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_58,&(this->compiler).lineIndices);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->lineIndices,local_58);
    if ((pointer)local_58._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
    }
    this->isDynamic_ = false;
    for (pvVar5 = (this->aatoken).
                  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar5 != (this->aatoken).
                  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pvVar5 = pvVar5 + 1) {
      pTVar2 = (pvVar5->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar3 = (pvVar5->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar7 = pTVar2 != pTVar3;
      if (bVar7) {
        bVar1 = *(byte *)((long)&pTVar2->tok + 1);
        while ((bVar1 & 0x10) == 0) {
          pTVar6 = pTVar2 + 1;
          bVar7 = pTVar6 != pTVar3;
          if (pTVar6 == pTVar3) break;
          bVar1 = *(byte *)((long)&pTVar2[1].tok + 1);
          pTVar2 = pTVar6;
        }
      }
      if (bVar7) {
        this->isDynamic_ = true;
        break;
      }
    }
    this->isLoaded_ = true;
  }
  else {
    this->error = true;
    SelectionCompiler::getErrorMessage_abi_cxx11_((string *)local_58,&this->compiler);
    std::__cxx11::string::operator=((string *)&this->errorMessage,(string *)local_58);
    if ((pointer)local_58._0_8_ != (pointer)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
    }
    snprintf(painCave.errMsg,2000,"SelectionCompiler Error: %s\n",
             (this->errorMessage)._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  return bVar4;
}

Assistant:

bool SelectionEvaluator::loadScript(const std::string& filename,
                                      const std::string& script) {
    clearDefinitionsAndLoadPredefined();
    this->filename = filename;
    this->script   = script;
    if (!compiler.compile(filename, script)) {
      error        = true;
      errorMessage = compiler.getErrorMessage();

      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SelectionCompiler Error: %s\n", errorMessage.c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
      return false;
    }

    pc          = 0;
    aatoken     = compiler.getAatokenCompiled();
    linenumbers = compiler.getLineNumbers();
    lineIndices = compiler.getLineIndices();

    std::vector<std::vector<Token>>::const_iterator i;

    isDynamic_ = false;
    for (i = aatoken.begin(); i != aatoken.end(); ++i) {
      if (containDynamicToken(*i)) {
        isDynamic_ = true;
        break;
      }
    }

    isLoaded_ = true;
    return true;
  }